

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_>
helics::MessageFederateManager::getMessage(Endpoint *ept)

{
  long in_RSI;
  undefined8 local_20;
  undefined1 local_18;
  
  if ((*(long *)(in_RSI + 0x48) != 0) &&
     (gmlc::containers::
      SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
      ::pop((SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
             *)&stack0xffffffffffffffe0), local_18 == '\x01')) {
    (ept->super_Interface)._vptr_Interface = (_func_int **)local_20;
    return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
           (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)ept;
  }
  (ept->super_Interface)._vptr_Interface = (_func_int **)0x0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)ept;
}

Assistant:

std::unique_ptr<Message> MessageFederateManager::getMessage(const Endpoint& ept)
{
    if (ept.dataReference != nullptr) {
        auto* eptDat = reinterpret_cast<EndpointData*>(ept.dataReference);
        auto message = eptDat->messages.pop();
        if (message) {
            return std::move(*message);
        }
    }
    return nullptr;
}